

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

void __thiscall
QVLABase<QList<Symbol>_>::reallocate_impl
          (QVLABase<QList<Symbol>_> *this,qsizetype prealloc,void *array,qsizetype asize,
          qsizetype aalloc)

{
  void *__src;
  long lVar1;
  undefined1 auVar2 [16];
  size_t __size;
  ulong uVar3;
  void *__dest;
  long lVar4;
  qsizetype qVar5;
  QArrayDataPointer<Symbol> *this_00;
  
  __src = (this->super_QVLABaseBase).ptr;
  lVar1 = (this->super_QVLABaseBase).a;
  lVar4 = (this->super_QVLABaseBase).s;
  qVar5 = asize;
  if (lVar4 < asize) {
    qVar5 = lVar4;
  }
  if (lVar1 != aalloc) {
    __dest = array;
    if (prealloc < aalloc) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = aalloc;
      __size = SUB168(auVar2 * ZEXT816(0x18),0);
      prealloc = aalloc;
      if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
        uVar3 = QtPrivate::expectedAllocSize(__size,0x10);
        if (uVar3 != 0) {
          prealloc = uVar3 / 0x18;
          __size = prealloc * 0x18;
        }
      }
      else {
        __size = 0;
      }
      if (__size == 0) {
        __dest = (void *)0x0;
      }
      else {
        __dest = malloc(__size);
      }
    }
    if (qVar5 != 0) {
      memcpy(__dest,__src,qVar5 * 0x18);
    }
    (this->super_QVLABaseBase).ptr = __dest;
    (this->super_QVLABaseBase).a = prealloc;
  }
  (this->super_QVLABaseBase).s = qVar5;
  if (asize < lVar4) {
    this_00 = (QArrayDataPointer<Symbol> *)(asize * 0x18 + (long)__src);
    lVar4 = lVar4 * 0x18 + asize * -0x18;
    do {
      QArrayDataPointer<Symbol>::~QArrayDataPointer(this_00);
      this_00 = this_00 + 1;
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
  }
  if ((__src != array) && (__src != (this->super_QVLABaseBase).ptr)) {
    QtPrivate::sizedFree(__src,lVar1 * 0x18);
    return;
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::reallocate_impl(qsizetype prealloc, void *array, qsizetype asize, qsizetype aalloc)
{
    Q_ASSERT(aalloc >= asize);
    Q_ASSERT(data());
    T *oldPtr = data();
    qsizetype osize = size();
    const qsizetype oalloc = capacity();

    const qsizetype copySize = qMin(asize, osize);
    Q_ASSERT(copySize >= 0);

    if (aalloc != oalloc) {
        QVLABaseBase::malloced_ptr guard;
        void *newPtr;
        qsizetype newA;
        if (aalloc > prealloc) {
            newPtr = QtPrivate::fittedMalloc(0, &aalloc, sizeof(T));
            guard.reset(newPtr);
            Q_CHECK_PTR(newPtr); // could throw
            // by design: in case of QT_NO_EXCEPTIONS malloc must not fail or it crashes here
            newA = aalloc;
        } else {
            newPtr = array;
            newA = prealloc;
        }
        QtPrivate::q_uninitialized_relocate_n(oldPtr, copySize,
                                              reinterpret_cast<T *>(newPtr));
        // commit:
        ptr = newPtr;
        guard.release();
        a = newA;
    }
    s = copySize;

    // destroy remaining old objects
    if constexpr (QTypeInfo<T>::isComplex) {
        if (osize > asize)
            std::destroy(oldPtr + asize, oldPtr + osize);
    }

    if (oldPtr != reinterpret_cast<T *>(array) && oldPtr != data())
        QtPrivate::sizedFree(oldPtr, oalloc, sizeof(T));
}